

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

bool chaiscript::dispatch::Proxy_Function_Base::compare_types
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tis,
               Function_Params *bvs,Type_Conversions_State *t_conversions)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar4 = (long)bvs->m_end - (long)bvs->m_begin >> 4;
  if (((long)(tis->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(tis->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1U == uVar4) {
    lVar5 = 0x18;
    lVar3 = 0;
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar4 == uVar6) break;
      bVar2 = compare_type_to_param
                        ((Type_Info *)
                         ((long)&((tis->
                                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar5),
                         (Boxed_Value *)
                         ((long)&(bvs->m_begin->m_data).
                                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar3),t_conversions);
      lVar3 = lVar3 + 0x10;
      lVar5 = lVar5 + 0x18;
      uVar1 = uVar6 + 1;
    } while (bVar2);
    bVar2 = uVar4 <= uVar6;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool compare_types(const std::vector<Type_Info> &tis, const Function_Params &bvs, const Type_Conversions_State &t_conversions) noexcept {
        if (tis.size() - 1 != bvs.size()) {
          return false;
        } else {
          const size_t size = bvs.size();
          for (size_t i = 0; i < size; ++i) {
            if (!compare_type_to_param(tis[i + 1], bvs[i], t_conversions)) {
              return false;
            }
          }
        }
        return true;
      }